

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall
Js::ScriptContext::RedeferFunctionBodies
          (ScriptContext *this,ActiveFunctionSet *pActiveFuncs,uint inactiveThreshold)

{
  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
  *this_00;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar1;
  Type pcVar2;
  long *plVar3;
  FunctionBody *pFVar4;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar5;
  FunctionEntryPointInfo *this_01;
  code *pcVar6;
  bool bVar7;
  State SVar8;
  bool bVar9;
  int iVar10;
  undefined4 *puVar11;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  
  iVar10 = (*(this->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
  if ((char)iVar10 != '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x45e,"(!this->IsClosed())","!this->IsClosed()");
    if (!bVar7) {
LAB_00791a50:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar11 = 0;
  }
  bVar7 = IsScriptContextInNonDebugMode(this);
  if (bVar7) {
    this_00 = &this->sourceList;
    if (((this->sourceList).ptr !=
         (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
          *)0x0) &&
       (pLVar12 = Memory::
                  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
                  ::operator->(this_00),
       0 < (pLVar12->
           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
           ).count)) {
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar15 = 0;
      do {
        pRVar1 = (pLVar12->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).buffer.ptr[lVar15].ptr;
        if ((((((ulong)pRVar1 & 1) == 0 &&
               pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) &&
             (pcVar2 = (pRVar1->super_RecyclerWeakReferenceBase).strongRef, pcVar2 != (Type)0x0)) &&
            (plVar3 = *(long **)(pcVar2 + 0x18), plVar3 != (long *)0x0)) &&
           (*(int *)((long)plVar3 + 0x1c) != 0)) {
          uVar14 = 0;
          do {
            iVar10 = *(int *)(*plVar3 + uVar14 * 4);
            while (iVar10 != -1) {
              lVar13 = (long)iVar10;
              iVar10 = *(int *)(plVar3[1] + 8 + lVar13 * 0x10);
              pFVar4 = *(FunctionBody **)(plVar3[1] + lVar13 * 0x10);
              if (pFVar4 == (FunctionBody *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar11 = 1;
                bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                            ,0xa2,"(functionBody)","functionBody");
                if (!bVar7) goto LAB_00791a50;
                *puVar11 = 0;
              }
              bVar7 = FunctionBody::InterpretedSinceCallCountCollection(pFVar4);
              FunctionBody::CollectInterpretedCounts(pFVar4);
              pSVar5 = (pFVar4->entryPoints).ptr;
              if ((pSVar5 != (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                              *)0x0) &&
                 (0 < (pSVar5->
                      super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ).
                      super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                      .count)) {
                lVar13 = 0;
                do {
                  this_01 = (FunctionEntryPointInfo *)
                            (((pSVar5->
                              super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                              ).
                              super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                              .buffer.ptr[lVar13].ptr)->super_RecyclerWeakReferenceBase).strongRef;
                  if (this_01 != (FunctionEntryPointInfo *)0x0) {
                    SVar8 = EntryPointInfo::GetState((EntryPointInfo *)this_01);
                    if ((SVar8 != CleanedUp) &&
                       (bVar9 = FunctionEntryPointInfo::ExecutedSinceCallCountCollection(this_01),
                       bVar9)) {
                      bVar7 = true;
                    }
                    FunctionEntryPointInfo::CollectCallCounts(this_01);
                  }
                  lVar13 = lVar13 + 1;
                } while (lVar13 < (pSVar5->
                                  super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                                  ).
                                  super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                                  .count);
              }
              if (bVar7 == false) {
                FunctionBody::IncrInactiveCount(pFVar4,inactiveThreshold);
              }
              else {
                pFVar4->inactiveCount = 0;
              }
              if (pActiveFuncs != (ActiveFunctionSet *)0x0) {
                bVar7 = ThreadContext::DoRedeferFunctionBodies(this->threadContext);
                if (!bVar7) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar11 = 1;
                  bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                              ,0x480,
                                              "(this->GetThreadContext()->DoRedeferFunctionBodies())"
                                              ,"this->GetThreadContext()->DoRedeferFunctionBodies()"
                                             );
                  if (!bVar7) goto LAB_00791a50;
                  *puVar11 = 0;
                }
                bVar7 = FunctionBody::DoRedeferFunction(pFVar4,inactiveThreshold);
                if (!bVar7) {
                  FunctionBody::UpdateActiveFunctionSet
                            (pFVar4,pActiveFuncs,(FunctionCodeGenRuntimeData *)0x0);
                }
              }
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < *(uint *)((long)plVar3 + 0x1c));
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < (pLVar12->
                        super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                        ).count);
    }
    if (((pActiveFuncs != (ActiveFunctionSet *)0x0) &&
        (this_00->ptr !=
         (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
          *)0x0)) &&
       (pLVar12 = Memory::
                  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
                  ::operator->(this_00),
       0 < (pLVar12->
           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
           ).count)) {
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar15 = 0;
      do {
        pRVar1 = (pLVar12->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).buffer.ptr[lVar15].ptr;
        if (((((ulong)pRVar1 & 1) == 0 && pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0
             ) && (pcVar2 = (pRVar1->super_RecyclerWeakReferenceBase).strongRef, pcVar2 != (Type)0x0
                  )) &&
           ((plVar3 = *(long **)(pcVar2 + 0x18), plVar3 != (long *)0x0 &&
            (*(int *)((long)plVar3 + 0x1c) != 0)))) {
          uVar14 = 0;
          do {
            iVar10 = *(int *)(*plVar3 + uVar14 * 4);
            while (iVar10 != -1) {
              lVar13 = (long)iVar10;
              iVar10 = *(int *)(plVar3[1] + 8 + lVar13 * 0x10);
              pFVar4 = *(FunctionBody **)(plVar3[1] + lVar13 * 0x10);
              if (pFVar4 == (FunctionBody *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar11 = 1;
                bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                            ,0xa2,"(functionBody)","functionBody");
                if (!bVar7) goto LAB_00791a50;
                *puVar11 = 0;
              }
              bVar7 = FunctionBody::IsActiveFunction(pFVar4,pActiveFuncs);
              if (bVar7) {
                pFVar4->field_0x17d = pFVar4->field_0x17d & 0xfd;
              }
              else {
                bVar7 = FunctionBody::DoRedeferFunction(pFVar4,inactiveThreshold);
                if (!bVar7) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar11 = 1;
                  bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                              ,0x494,
                                              "(functionBody->DoRedeferFunction(inactiveThreshold))"
                                              ,"functionBody->DoRedeferFunction(inactiveThreshold)")
                  ;
                  if (!bVar7) goto LAB_00791a50;
                  *puVar11 = 0;
                }
                FunctionBody::RedeferFunction(pFVar4);
              }
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < *(uint *)((long)plVar3 + 0x1c));
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < (pLVar12->
                        super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                        ).count);
    }
  }
  return;
}

Assistant:

void ScriptContext::RedeferFunctionBodies(ActiveFunctionSet *pActiveFuncs, uint inactiveThreshold)
    {
        Assert(!this->IsClosed());

        if (!this->IsScriptContextInNonDebugMode())
        {
            return;
        }

        // For each active function, collect call counts, update inactive counts, and redefer if appropriate.
        // In the redeferral case, we require 2 passes over the set of FunctionBody's.
        // This is because a function inlined in a non-redeferred function cannot itself be redeferred.
        // So we first need to close over the set of non-redeferrable functions, then go back and redefer
        // the eligible candidates.

        auto fn = [&](FunctionBody *functionBody) {
            bool exec = functionBody->InterpretedSinceCallCountCollection();
            functionBody->CollectInterpretedCounts();
            functionBody->MapEntryPoints([&](int index, FunctionEntryPointInfo *entryPointInfo) {
                if (!entryPointInfo->IsCleanedUp() && entryPointInfo->ExecutedSinceCallCountCollection())
                {
                    exec = true;
                }
                entryPointInfo->CollectCallCounts();
            });
            if (exec)
            {
                functionBody->SetInactiveCount(0);
            }
            else
            {
                functionBody->IncrInactiveCount(inactiveThreshold);
            }

            if (pActiveFuncs)
            {
                Assert(this->GetThreadContext()->DoRedeferFunctionBodies());
                bool doRedefer = functionBody->DoRedeferFunction(inactiveThreshold);
                if (!doRedefer)
                {
                    functionBody->UpdateActiveFunctionSet(pActiveFuncs, nullptr);
                }
            }
        };

        this->MapFunction(fn);

        if (!pActiveFuncs)
        {
            return;
        }

        auto fnRedefer = [&](FunctionBody * functionBody) {
            Assert(pActiveFuncs);
            if (!functionBody->IsActiveFunction(pActiveFuncs))
            {
                Assert(functionBody->DoRedeferFunction(inactiveThreshold));
                functionBody->RedeferFunction();
            }
            else
            {
                functionBody->ResetRedeferralAttributes();
            }
        };

        this->MapFunction(fnRedefer);
    }